

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O1

cram_record * cram_get_seq(cram_fd *fd)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  cram_container *pcVar2;
  cram_block_slice_hdr *pcVar3;
  cram_record *pcVar4;
  cram_slice *pcVar5;
  int iVar6;
  cram_container *pcVar7;
  cram_block *pcVar8;
  cram_block_compression_hdr *pcVar9;
  t_pool_result *r;
  void *pvVar10;
  cram_slice *pcVar11;
  bool bVar12;
  
  __mutex = &fd->ref_lock;
  do {
    pcVar2 = fd->ctr;
    pcVar7 = pcVar2;
    if (pcVar2 == (cram_container *)0x0) {
LAB_00146673:
      do {
        pcVar7 = cram_read_container(fd);
        fd->ctr = pcVar7;
        if (pcVar7 == (cram_container *)0x0) goto LAB_00146851;
      } while (pcVar7->length == 0);
      if (((fd->range).refid != -2) && (iVar6 = pcVar7->ref_seq_id, iVar6 != -2)) {
        bVar12 = false;
        do {
          iVar1 = (fd->range).refid;
          if ((iVar1 <= iVar6) && ((fd->range).start < pcVar7->ref_seq_span + pcVar7->ref_seq_start)
             ) {
            if ((bool)(~bVar12 & iVar6 != iVar1)) goto LAB_00146851;
            break;
          }
          iVar6 = cram_seek(fd,(long)pcVar7->length,1);
          if (iVar6 != 0) goto LAB_00146851;
          cram_free_container(fd->ctr);
          do {
            pcVar7 = cram_read_container(fd);
            fd->ctr = pcVar7;
            if (pcVar7 == (cram_container *)0x0) goto LAB_00146851;
          } while (pcVar7->length == 0);
          iVar6 = pcVar7->ref_seq_id;
          bVar12 = iVar6 == -2;
        } while (!bVar12);
      }
      pcVar8 = cram_read_block(fd);
      pcVar7->comp_hdr_block = pcVar8;
      if ((pcVar8 != (cram_block *)0x0) && (pcVar8->content_type == COMPRESSION_HEADER)) {
        pcVar9 = cram_decode_compression_header(fd,pcVar8);
        pcVar7->comp_hdr = pcVar9;
        if (pcVar9 != (cram_block_compression_hdr *)0x0) {
          if (pcVar9->AP_delta == 0) {
            pthread_mutex_lock((pthread_mutex_t *)__mutex);
            fd->unsorted = 1;
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
LAB_001463a5:
          pcVar11 = pcVar7->slice;
          if (pcVar11 != (cram_slice *)0x0) {
            pcVar7->slice = (cram_slice *)0x0;
            cram_free_slice(pcVar11);
          }
          pcVar11 = (cram_slice *)0x0;
          pcVar5 = (cram_slice *)0x0;
          if (pcVar7->curr_slice != pcVar7->max_slice) goto LAB_001463eb;
LAB_001463da:
          cram_free_container(pcVar7);
          pcVar7 = (cram_container *)0x0;
          pcVar5 = pcVar11;
LAB_001463eb:
          do {
            pcVar11 = pcVar5;
            pvVar10 = fd->job_pending;
LAB_001463f2:
            if (pvVar10 == (void *)0x0) {
              if (fd->ooc == 0) {
                do {
                  if ((pcVar7 == (cram_container *)0x0) || (pcVar7->curr_slice == pcVar7->max_slice)
                     ) {
                    do {
                      pcVar7 = cram_read_container(fd);
                      fd->ctr = pcVar7;
                      if (pcVar7 == (cram_container *)0x0) {
                        if (fd->pool == (t_pool *)0x0) goto LAB_00146851;
                        fd->ooc = 1;
                        break;
                      }
                    } while (pcVar7->length == 0);
                    if (fd->ooc != 0) goto LAB_0014679f;
                    iVar6 = (fd->range).refid;
                    if ((iVar6 != -2) && (iVar1 = pcVar7->ref_seq_id, iVar1 != -2)) {
                      *(byte *)&fd->required_fields = (byte)fd->required_fields | 8;
                      if ((iVar1 != iVar6) || ((fd->range).end < pcVar7->ref_seq_start)) {
                        cram_free_container(pcVar7);
                        fd->ctr = (cram_container *)0x0;
                        fd->ooc = 1;
                        fd->eof = 1;
                        goto LAB_0014679f;
                      }
                      if (pcVar7->ref_seq_start + pcVar7->ref_seq_span <= (fd->range).start)
                      goto LAB_0014651e;
                    }
                    pcVar8 = cram_read_block(fd);
                    pcVar7->comp_hdr_block = pcVar8;
                    if ((pcVar8 == (cram_block *)0x0) ||
                       (pcVar8->content_type != COMPRESSION_HEADER)) goto LAB_00146851;
                    pcVar9 = cram_decode_compression_header(fd,pcVar8);
                    pcVar7->comp_hdr = pcVar9;
                    if (pcVar9 == (cram_block_compression_hdr *)0x0) goto LAB_00146851;
                    if (pcVar9->AP_delta == 0) {
                      pthread_mutex_lock((pthread_mutex_t *)__mutex);
                      fd->unsorted = 1;
                      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                    }
                  }
                  if (pcVar7->num_records != 0) {
                    pcVar11 = cram_read_slice(fd);
                    pcVar7->slice = pcVar11;
                    if (pcVar11 == (cram_slice *)0x0) goto LAB_00146851;
                    pcVar7->curr_slice = pcVar7->curr_slice + 1;
                    pcVar7->curr_rec = 0;
                    pcVar3 = pcVar11->hdr;
                    pcVar7->max_rec = pcVar3->num_records;
                    iVar6 = pcVar3->ref_seq_start;
                    pcVar11->last_apos = iVar6;
                    iVar1 = (fd->range).refid;
                    if ((iVar1 == -2) || (pcVar3->ref_seq_id == -2)) break;
                    if ((pcVar3->ref_seq_id != iVar1) || ((fd->range).end < iVar6)) {
                      fd->eof = 1;
                      cram_free_slice(pcVar11);
                      pcVar7->slice = (cram_slice *)0x0;
                      goto LAB_00146851;
                    }
                    if ((fd->range).start < iVar6 + pcVar3->ref_seq_span) break;
                    cram_free_slice(pcVar11);
                    pcVar7->slice = (cram_slice *)0x0;
                    goto LAB_001463da;
                  }
                  cram_free_container(pcVar7);
                  pcVar7 = (cram_container *)0x0;
                } while( true );
              }
            }
            else {
              pcVar7 = *(cram_container **)((long)pvVar10 + 8);
              pcVar11 = *(cram_slice **)((long)pvVar10 + 0x10);
              free(pvVar10);
              fd->job_pending = (void *)0x0;
            }
            if ((pcVar7 == (cram_container *)0x0) || (pcVar11 == (cram_slice *)0x0))
            goto LAB_0014679f;
            iVar6 = cram_decode_slice_mt(fd,pcVar7,pcVar11,fd->header);
            if (iVar6 != 0) {
              cram_get_seq_cold_1();
              break;
            }
            if (((fd->pool == (t_pool *)0x0) || (fd->job_pending != (void *)0x0)) ||
               (iVar6 = t_pool_results_queue_len(fd->rqueue), pcVar5 = pcVar11,
               fd->pool->qsize < iVar6)) {
LAB_0014679f:
              if (fd->pool != (t_pool *)0x0) {
                if ((fd->ooc == 0) || (iVar6 = t_pool_results_queue_empty(fd->rqueue), iVar6 == 0))
                {
                  r = t_pool_next_result_wait(fd->rqueue);
                  if ((r == (t_pool_result *)0x0) || (pvVar10 = r->data, pvVar10 == (void *)0x0)) {
                    cram_get_seq_cold_2();
                    goto LAB_001467c3;
                  }
                  pcVar7 = *(cram_container **)((long)pvVar10 + 8);
                  pcVar11 = *(cram_slice **)((long)pvVar10 + 0x10);
                  fd->ctr = pcVar7;
                  t_pool_delete_result(r,1);
                  bVar12 = true;
                }
                else {
LAB_001467c3:
                  bVar12 = false;
                }
                if (!bVar12) {
                  pcVar7 = pcVar2;
                  pcVar11 = (cram_slice *)0x0;
                }
              }
              goto LAB_00146854;
            }
          } while( true );
        }
      }
LAB_00146851:
      pcVar7 = pcVar2;
      pcVar11 = (cram_slice *)0x0;
LAB_00146854:
      if (pcVar11 == (cram_slice *)0x0) {
        return (cram_record *)0x0;
      }
    }
    else {
      pcVar11 = pcVar2->slice;
      if ((pcVar11 == (cram_slice *)0x0) || (pcVar2->max_rec <= pcVar2->curr_rec)) {
        if (pcVar2 != (cram_container *)0x0) goto LAB_001463a5;
        goto LAB_00146673;
      }
    }
    iVar6 = (fd->range).refid;
    if (iVar6 == -2) {
LAB_001468a3:
      fd->ctr = pcVar7;
      pcVar7->slice = pcVar11;
      iVar6 = pcVar7->curr_rec;
      pcVar4 = pcVar11->crecs;
      pcVar7->curr_rec = iVar6 + 1;
      return pcVar4 + iVar6;
    }
    pcVar4 = pcVar11->crecs;
    iVar1 = pcVar7->curr_rec;
    if (iVar6 <= pcVar4[iVar1].ref_id) {
      if ((pcVar4[iVar1].ref_id != iVar6) || ((fd->range).end < pcVar4[iVar1].apos)) {
        fd->eof = 1;
        cram_free_slice(pcVar11);
        pcVar7->slice = (cram_slice *)0x0;
        return (cram_record *)0x0;
      }
      if ((fd->range).start <= pcVar4[iVar1].aend) goto LAB_001468a3;
    }
    pcVar7->curr_rec = iVar1 + 1;
  } while( true );
LAB_0014651e:
  pcVar7->curr_rec = pcVar7->max_rec;
  pcVar7->curr_slice = pcVar7->max_slice;
  cram_seek(fd,(long)pcVar7->length,1);
  cram_free_container(pcVar7);
  pvVar10 = fd->job_pending;
  pcVar7 = (cram_container *)0x0;
  goto LAB_001463f2;
}

Assistant:

cram_record *cram_get_seq(cram_fd *fd) {
    cram_container *c;
    cram_slice *s;

    for (;;) {
	c = fd->ctr;
	if (c && c->slice && c->curr_rec < c->max_rec) {
	    s = c->slice;
	} else {
	    if (!(s = cram_next_slice(fd, &c)))
		return NULL;
	}

	if (fd->range.refid != -2) {
	    if (s->crecs[c->curr_rec].ref_id < fd->range.refid) {
		c->curr_rec++;
		continue;
	    }

	    if (s->crecs[c->curr_rec].ref_id != fd->range.refid) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].apos > fd->range.end) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].aend < fd->range.start) {
		c->curr_rec++;
		continue;
	    }
	}

	break;
    }

    fd->ctr = c;
    c->slice = s;
    return &s->crecs[c->curr_rec++];
}